

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

void t1_dec_sigpass_step_mqc(opj_t1_t *t1,flag_t *flagsp,int *datap,int orient,int oneplushalf)

{
  long lVar1;
  char cVar2;
  uint f;
  int iVar3;
  uint uVar4;
  int in_ECX;
  int *in_RDX;
  ushort *in_RSI;
  long in_RDI;
  int in_R8D;
  opj_mqc_t *mqc;
  int flag;
  int v;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  lVar1 = *(long *)(in_RDI + 8);
  f = (uint)(short)*in_RSI;
  if (((f & 0xff) != 0) && ((f & 0x5000) == 0)) {
    cVar2 = t1_getctxno_zc(f,in_ECX);
    *(long *)(lVar1 + 0xc0) = lVar1 + 0x28 + (long)(int)cVar2 * 8;
    iVar3 = mqc_decode((opj_mqc_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    if (iVar3 != 0) {
      cVar2 = t1_getctxno_sc(f);
      *(long *)(lVar1 + 0xc0) = lVar1 + 0x28 + (long)(int)cVar2 * 8;
      uVar4 = mqc_decode((opj_mqc_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0))
      ;
      cVar2 = t1_getspb(f);
      if ((uVar4 ^ (int)cVar2) != 0) {
        in_R8D = -in_R8D;
      }
      *in_RDX = in_R8D;
      t1_updateflags((flag_t *)in_RSI,uVar4 ^ (int)cVar2,*(int *)(in_RDI + 0x38));
    }
    *in_RSI = *in_RSI | 0x4000;
  }
  return;
}

Assistant:

static INLINE void t1_dec_sigpass_step_mqc(
		opj_t1_t *t1,
		flag_t *flagsp,
		int *datap,
		int orient,
		int oneplushalf)
{
	int v, flag;
	
	opj_mqc_t *mqc = t1->mqc;	/* MQC component */
	
	flag = *flagsp;
	if ((flag & T1_SIG_OTH) && !(flag & (T1_SIG | T1_VISIT))) {
			mqc_setcurctx(mqc, t1_getctxno_zc(flag, orient));
			if (mqc_decode(mqc)) {
				mqc_setcurctx(mqc, t1_getctxno_sc(flag));
				v = mqc_decode(mqc) ^ t1_getspb(flag);
				*datap = v ? -oneplushalf : oneplushalf;
				t1_updateflags(flagsp, v, t1->flags_stride);
			}
		*flagsp |= T1_VISIT;
	}
}